

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_syntax.cpp
# Opt level: O0

ParserResult *
parse_const_statement
          (ParserResult *__return_storage_ptr__,ParserContext *parser,token_iterator begin,
          token_iterator end)

{
  bool bVar1;
  unreachable_exception *this;
  SyntaxTree *pSVar2;
  element_type *peVar3;
  shared_ptr<SyntaxTree> *psVar4;
  NodeType local_5c4;
  ParserStatus local_5ac;
  ParserState local_5a8;
  undefined4 local_54c;
  shared_ptr<SyntaxTree> local_548;
  ParserSuccess local_538;
  pair<const_TokenStream::TokenData_*,_ParserSuccess> local_528;
  shared_ptr<SyntaxTree> local_510;
  shared_ptr<SyntaxTree> local_500;
  shared_ptr<SyntaxTree> local_4f0;
  undefined1 local_4e0 [8];
  shared_ptr<SyntaxTree> tree;
  ParserState local_478;
  tuple<TokenStream::TokenData_const*&,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>&>
  local_420 [16];
  ParserResult local_410;
  variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_> local_3b0;
  ParserState local_358;
  tuple<TokenStream::TokenData_const*&,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>&>
  local_300 [16];
  ParserResult local_2f0;
  variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_> local_290;
  ParserState local_238;
  tuple<TokenStream::TokenData_const*&,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>&>
  local_1e0 [16];
  ParserResult local_1d0;
  undefined1 local_170 [8];
  TokenData *it;
  undefined1 local_151;
  undefined8 local_150;
  undefined4 local_144;
  undefined1 local_140 [4];
  NodeType type;
  ParserState value;
  ParserState identifier;
  undefined1 local_80 [8];
  ParserState state;
  token_iterator end_local;
  token_iterator begin_local;
  ParserContext *parser_local;
  
  state._storage.
  super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
  .
  super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
  ._which = (size_t)end;
  end_local = begin;
  begin_local = (token_iterator)parser;
  parser_local = (ParserContext *)__return_storage_ptr__;
  if ((begin == end) || ((begin->type != CONST_INT && (begin->type != CONST_FLOAT)))) {
    local_5ac = GiveUp;
    make_error<ParserStatus,TokenStream::TokenData_const*&>(&local_5a8,&local_5ac,&end_local);
    std::
    make_pair<TokenStream::TokenData_const*&,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>>
              (__return_storage_ptr__,
               (TokenData **)
               &state._storage.
                super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                .
                super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
                ._which,&local_5a8);
    eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>::~variant
              (&local_5a8);
  }
  else {
    ParserSuccess::ParserSuccess
              ((ParserSuccess *)
               &identifier._storage.
                super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                .
                super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
                ._which,(nullptr_t)0x0);
    eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>::
    variant<ParserSuccess,0ul,ParserSuccess>
              ((variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>> *)local_80,
               (ParserSuccess *)
               &identifier._storage.
                super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                .
                super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
                ._which);
    ParserSuccess::~ParserSuccess
              ((ParserSuccess *)
               &identifier._storage.
                super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                .
                super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
                ._which);
    eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>::variant
              ((variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_> *)
               &value._storage.
                super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                .
                super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
                ._which);
    eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>::variant
              ((variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_> *)local_140);
    local_151 = 0;
    if (end_local->type == CONST_INT) {
      local_5c4 = CONST_INT;
    }
    else {
      if (end_local->type != CONST_FLOAT) {
        this = (unreachable_exception *)__cxa_allocate_exception(0x10);
        local_151 = 1;
        local_150 = this;
        unreachable_exception::unreachable_exception
                  (this,
                   "Unreachable code reached at /workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/parser_syntax.cpp(783)."
                  );
        __cxa_throw(this,&unreachable_exception::typeinfo,
                    unreachable_exception::~unreachable_exception);
      }
      local_5c4 = CONST_FLOAT;
    }
    local_144 = local_5c4;
    local_170 = (undefined1  [8])std::next<TokenStream::TokenData_const*>(end_local,1);
    parse_identifier(&local_1d0,(ParserContext *)begin_local,(token_iterator)local_170,
                     (token_iterator)
                     state._storage.
                     super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                     .
                     super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
                     ._which);
    std::
    tie<TokenStream::TokenData_const*,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>>
              ((TokenData **)local_1e0,
               (variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_> *)local_170);
    std::
    tuple<TokenStream::TokenData_const*&,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>&>
    ::operator=(local_1e0,&local_1d0);
    std::
    pair<const_TokenStream::TokenData_*,_eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>_>
    ::~pair(&local_1d0);
    eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>::variant
              (&local_290,
               (variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_> *)
               &value._storage.
                super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                .
                super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
                ._which);
    giveup_to_expected(&local_238,&local_290,"identifier");
    add_error((ParserState *)local_80,&local_238);
    eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>::~variant
              (&local_238);
    eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>::~variant
              (&local_290);
    if (local_144 == CONST_INT) {
      parse_integer(&local_2f0,(ParserContext *)begin_local,(token_iterator)local_170,
                    (token_iterator)
                    state._storage.
                    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                    .
                    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
                    ._which);
      std::
      tie<TokenStream::TokenData_const*,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>>
                ((TokenData **)local_300,
                 (variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_> *)local_170);
      std::
      tuple<TokenStream::TokenData_const*&,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>&>
      ::operator=(local_300,&local_2f0);
      std::
      pair<const_TokenStream::TokenData_*,_eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>_>
      ::~pair(&local_2f0);
      eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>::variant
                (&local_3b0,
                 (variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_> *)local_140);
      giveup_to_expected(&local_358,&local_3b0,"integer");
      add_error((ParserState *)local_80,&local_358);
      eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>::~variant
                (&local_358);
      eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>::~variant
                (&local_3b0);
    }
    else if (local_144 == CONST_FLOAT) {
      parse_float(&local_410,(ParserContext *)begin_local,(token_iterator)local_170,
                  (token_iterator)
                  state._storage.
                  super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                  .
                  super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
                  ._which);
      std::
      tie<TokenStream::TokenData_const*,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>>
                ((TokenData **)local_420,
                 (variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_> *)local_170);
      std::
      tuple<TokenStream::TokenData_const*&,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>&>
      ::operator=(local_420,&local_410);
      std::
      pair<const_TokenStream::TokenData_*,_eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>_>
      ::~pair(&local_410);
      eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>::variant
                ((variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_> *)
                 &tree.super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_> *)local_140);
      giveup_to_expected(&local_478,
                         (ParserState *)
                         &tree.super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,"float");
      add_error((ParserState *)local_80,&local_478);
      eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>::~variant
                (&local_478);
      eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>::~variant
                ((variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_> *)
                 &tree.super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    expect_newline((ParserState *)local_80,(token_iterator)local_170,
                   (token_iterator)
                   state._storage.
                   super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                   .
                   super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
                   ._which);
    local_170 = (undefined1  [8])
                parser_aftertoken((token_iterator)local_170,
                                  (token_iterator)
                                  state._storage.
                                  super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                                  .
                                  super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
                                  ._which,NewLine);
    bVar1 = is<ParserSuccess,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>>
                      ((variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_> *)
                       local_80);
    if (bVar1) {
      pSVar2 = (SyntaxTree *)operator_new(0x88);
      SyntaxTree::SyntaxTree
                (pSVar2,local_144,(shared_ptr<SyntaxTree::InputStream> *)&begin_local->end,end_local
                );
      std::shared_ptr<SyntaxTree>::shared_ptr<SyntaxTree,void>
                ((shared_ptr<SyntaxTree> *)local_4e0,pSVar2);
      peVar3 = std::__shared_ptr_access<SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_4e0);
      pSVar2 = (SyntaxTree *)operator_new(0x88);
      SyntaxTree::SyntaxTree
                (pSVar2,Text,(shared_ptr<SyntaxTree::InputStream> *)&begin_local->end,end_local);
      std::shared_ptr<SyntaxTree>::shared_ptr<SyntaxTree,void>(&local_4f0,pSVar2);
      SyntaxTree::add_child(peVar3,&local_4f0);
      std::shared_ptr<SyntaxTree>::~shared_ptr(&local_4f0);
      peVar3 = std::__shared_ptr_access<SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_4e0);
      psVar4 = &eggs::variants::
                get<ParserSuccess,ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>,0ul>
                          ((variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_> *)
                           &value._storage.
                            super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                            .
                            super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
                            ._which)->tree;
      std::shared_ptr<SyntaxTree>::shared_ptr(&local_500,psVar4);
      SyntaxTree::add_child(peVar3,&local_500);
      std::shared_ptr<SyntaxTree>::~shared_ptr(&local_500);
      peVar3 = std::__shared_ptr_access<SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_4e0);
      psVar4 = &eggs::variants::
                get<ParserSuccess,ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>,0ul>
                          ((variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_> *)
                           local_140)->tree;
      std::shared_ptr<SyntaxTree>::shared_ptr(&local_510,psVar4);
      SyntaxTree::add_child(peVar3,&local_510);
      std::shared_ptr<SyntaxTree>::~shared_ptr(&local_510);
      std::shared_ptr<SyntaxTree>::shared_ptr(&local_548,(shared_ptr<SyntaxTree> *)local_4e0);
      ParserSuccess::ParserSuccess(&local_538,&local_548);
      std::make_pair<TokenStream::TokenData_const*&,ParserSuccess>
                (&local_528,(TokenData **)local_170,&local_538);
      std::
      pair<const_TokenStream::TokenData_*,_eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>_>
      ::pair<const_TokenStream::TokenData_*,_ParserSuccess,_true>(__return_storage_ptr__,&local_528)
      ;
      std::pair<const_TokenStream::TokenData_*,_ParserSuccess>::~pair(&local_528);
      ParserSuccess::~ParserSuccess(&local_538);
      std::shared_ptr<SyntaxTree>::~shared_ptr(&local_548);
      local_54c = 1;
      std::shared_ptr<SyntaxTree>::~shared_ptr((shared_ptr<SyntaxTree> *)local_4e0);
    }
    else {
      std::
      make_pair<TokenStream::TokenData_const*&,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>>
                (__return_storage_ptr__,(TokenData **)local_170,
                 (variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_> *)local_80);
      local_54c = 1;
    }
    eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>::~variant
              ((variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_> *)local_140);
    eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>::~variant
              ((variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_> *)
               &value._storage.
                super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                .
                super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
                ._which);
    eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>::~variant
              ((variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_> *)local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

static ParserResult parse_const_statement(ParserContext& parser, token_iterator begin, token_iterator end)
{
    if(begin != end
        && (begin->type == Token::CONST_INT || begin->type == Token::CONST_FLOAT))
    {
        ParserState state = ParserSuccess(nullptr);
        ParserState identifier, value;

        auto type = begin->type == Token::CONST_INT? NodeType::CONST_INT :
                    begin->type == Token::CONST_FLOAT? NodeType::CONST_FLOAT : Unreachable();

        auto it = std::next(begin);
        std::tie(it, identifier) = parse_identifier(parser, it, end);
        add_error(state, giveup_to_expected(identifier, "identifier"));

        if(type == NodeType::CONST_INT)
        {
            std::tie(it, value) = parse_integer(parser, it, end);
            add_error(state, giveup_to_expected(value, "integer"));
        }
        else if(type == NodeType::CONST_FLOAT)
        {
            std::tie(it, value) = parse_float(parser, it, end);
            add_error(state, giveup_to_expected(value, "float"));
        }

        expect_newline(state, it, end);
        it = parser_aftertoken(it, end, Token::NewLine);

        if(is<ParserSuccess>(state))
        {
            shared_ptr<SyntaxTree> tree(new SyntaxTree(type, parser.instream, *begin));
            tree->add_child(shared_ptr<SyntaxTree> { new SyntaxTree(NodeType::Text, parser.instream, *begin) });
            tree->add_child(get<ParserSuccess>(identifier).tree);
            tree->add_child(get<ParserSuccess>(value).tree);
            return std::make_pair(it, ParserSuccess(std::move(tree)));
        }
        else
        {
            return std::make_pair(it, std::move(state));
        }
    }
    return std::make_pair(end, make_error(ParserStatus::GiveUp, begin));
}